

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O1

TestObject * __thiscall StressTester::CreateLinkedList(StressTester *this)

{
  int iVar1;
  size_t sVar2;
  TestObject *pTVar3;
  TestObject *pTVar4;
  TestObject *pTVar5;
  long lVar6;
  ulong uVar7;
  Recycler *recycler;
  Recycler *recycler_00;
  int iVar8;
  
  recycler = this->recycler;
  sVar2 = GetRandomSize(this);
  iVar8 = 0;
  pTVar3 = TestObject::Create(recycler,1,sVar2,NormalObj);
  iVar1 = PAL_rand();
  iVar1 = iVar1 % 100;
  if (0 < iVar1) {
    pTVar4 = pTVar3;
    do {
      recycler_00 = this->recycler;
      sVar2 = GetRandomSize((StressTester *)recycler);
      pTVar5 = TestObject::Create(recycler_00,(uint)(iVar8 != iVar1 + -1),sVar2,NormalObj);
      if (0 < (long)pTVar4->pointerCount) {
        uVar7 = (ulong)((long)&pTVar4[2].size + 7) & 0xffffffffffffffe0;
        lVar6 = 0;
        do {
          if (*(long *)(uVar7 + lVar6 * 8) == 0) {
            *(TestObject **)(uVar7 + lVar6 * 8) = pTVar5;
            break;
          }
          lVar6 = lVar6 + 1;
        } while (pTVar4->pointerCount != lVar6);
      }
      iVar8 = iVar8 + 1;
      pTVar4 = pTVar5;
      recycler = recycler_00;
    } while (iVar8 != iVar1);
  }
  return pTVar3;
}

Assistant:

TestObject* StressTester::CreateLinkedList()
{
    TestObject *root = TestObject::Create(recycler, 1, GetRandomSize());
    TestObject *curr = root;
    int length = rand() % MaxLinkedListLength;
    for (int i = 0; i < length; ++i)
    {
        CreateOptions options = (i == length - 1) ? LeafObj : NormalObj;
        TestObject *next = TestObject::Create(recycler, options == LeafObj ? 0 : 1, GetRandomSize());
        curr->Add(next);
        curr = next;
    }
    return root;
}